

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O1

void __thiscall Highs::reportModelStats(Highs *this)

{
  HighsHessian *this_00;
  HighsLogOptions *log_options_;
  double dVar1;
  HighsVarType HVar2;
  pointer pHVar3;
  ostream *poVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  string problem_type;
  stringstream stats_line;
  uint local_208;
  uint local_204;
  char *local_200;
  long local_1f8;
  char local_1f0 [16];
  HighsLogOptions *local_1e0;
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  if (*(this->options_).super_HighsOptionsStruct.log_options.output_flag == true) {
    this_00 = &(this->model_).hessian_;
    pHVar3 = (this->model_).lp_.integrality_.
             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (int)(this->model_).lp_.integrality_.
                 super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                 super__Vector_impl_data._M_finish - (int)pHVar3;
    if ((int)uVar5 < 1) {
      uVar12 = 0;
      uVar9 = 0;
      local_204 = 0;
      uVar11 = 0;
    }
    else {
      uVar10 = 0;
      uVar11 = 0;
      local_204 = 0;
      uVar9 = 0;
      uVar12 = 0;
      do {
        HVar2 = pHVar3[uVar10];
        if (HVar2 == kSemiInteger) {
          uVar9 = uVar9 + 1;
        }
        else if (HVar2 == kSemiContinuous) {
          uVar12 = uVar12 + 1;
        }
        else if (HVar2 == kInteger) {
          uVar11 = uVar11 + 1;
          dVar1 = (this->model_).lp_.col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar10];
          if ((((dVar1 == 0.0) && (!NAN(dVar1))) &&
              (dVar1 = (this->model_).lp_.col_upper_.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10], dVar1 == 1.0)) && (!NAN(dVar1))) {
            local_204 = local_204 + 1;
          }
        }
        uVar10 = uVar10 + 1;
      } while ((uVar5 & 0x7fffffff) != uVar10);
    }
    local_200 = local_1f0;
    local_1f8 = 0;
    local_1f0[0] = '\0';
    bVar13 = uVar11 + uVar12 + uVar9 == 0;
    pcVar7 = "MIP ";
    if (bVar13) {
      pcVar7 = "LP  ";
    }
    pcVar6 = "MIQP";
    if (bVar13) {
      pcVar6 = "QP  ";
    }
    if (this_00->dim_ == 0) {
      pcVar6 = pcVar7;
    }
    std::__cxx11::string::_M_replace((ulong)&local_200,0,(char *)0x0,(ulong)pcVar6);
    uVar5 = HighsSparseMatrix::numNz(&(this->model_).lp_.a_matrix_);
    if (this_00->dim_ < 1) {
      local_208 = 0;
    }
    else {
      local_208 = HighsHessian::numNz(this_00);
    }
    log_options_ = &(this->options_).super_HighsOptionsStruct.log_options;
    if (*(this->options_).super_HighsOptionsStruct.log_options.log_dev_level == 0) {
      local_1e0 = log_options_;
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_200,local_1f8);
      if ((this->model_).lp_.model_name_._M_string_length != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(this->model_).lp_.model_name_._M_dataplus._M_p,
                   (this->model_).lp_.model_name_._M_string_length);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," has ",5);
      poVar4 = (ostream *)std::ostream::operator<<(local_1a8,(this->model_).lp_.num_row_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," rows; ",7);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this->model_).lp_.num_col_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," cols",5);
      if (local_208 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"; ",2);
        poVar4 = (ostream *)std::ostream::operator<<(local_1a8,uVar5);
        lVar8 = 9;
        pcVar7 = " nonzeros";
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"; ",2);
        poVar4 = (ostream *)std::ostream::operator<<(local_1a8,uVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," matrix nonzeros",0x10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"; ",2);
        poVar4 = (ostream *)std::ostream::operator<<(local_1a8,local_208);
        lVar8 = 0x11;
        pcVar7 = " Hessian nonzeros";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,lVar8);
      if (uVar11 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"; ",2);
        poVar4 = (ostream *)std::ostream::operator<<(local_1a8,uVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," integer variables (",0x14);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_204);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," binary)",8);
      }
      if (uVar12 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"; ",2);
        poVar4 = (ostream *)std::ostream::operator<<(local_1a8,uVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," semi-continuous variables",0x1a)
        ;
      }
      if (uVar9 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"; ",2);
        poVar4 = (ostream *)std::ostream::operator<<(local_1a8,uVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," semi-integer variables",0x17);
      }
      std::__cxx11::stringbuf::str();
      highsLogUser(local_1e0,kInfo,"%s\n",local_1d8);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    }
    else {
      highsLogDev(log_options_,kInfo,"%4s      : %s\n",local_200,
                  (this->model_).lp_.model_name_._M_dataplus._M_p);
      highsLogDev(log_options_,kInfo,"Rows      : %d\n",(ulong)(uint)(this->model_).lp_.num_row_);
      highsLogDev(log_options_,kInfo,"Cols      : %d\n",(ulong)(uint)(this->model_).lp_.num_col_);
      if (local_208 == 0) {
        pcVar7 = "Nonzeros  : %d\n";
      }
      else {
        highsLogDev(log_options_,kInfo,"Matrix Nz : %d\n",(ulong)uVar5);
        pcVar7 = "Hessian Nz: %d\n";
        uVar5 = local_208;
      }
      highsLogDev(log_options_,kInfo,pcVar7,(ulong)uVar5);
      if (uVar11 != 0) {
        highsLogDev(log_options_,kInfo,"Integer   : %d (%d binary)\n",(ulong)uVar11,(ulong)local_204
                   );
      }
      if (uVar12 != 0) {
        highsLogDev(log_options_,kInfo,"SemiConts : %d\n",(ulong)uVar12);
      }
      if (uVar9 != 0) {
        highsLogDev(log_options_,kInfo,"SemiInt   : %d\n",(ulong)uVar9);
      }
    }
    if (local_200 != local_1f0) {
      operator_delete(local_200);
    }
  }
  return;
}

Assistant:

void Highs::reportModelStats() const {
  const HighsLp& lp = this->model_.lp_;
  const HighsHessian& hessian = this->model_.hessian_;
  const HighsLogOptions& log_options = this->options_.log_options;
  if (!*log_options.output_flag) return;
  HighsInt num_integer = 0;
  HighsInt num_binary = 0;
  HighsInt num_semi_continuous = 0;
  HighsInt num_semi_integer = 0;
  for (HighsInt iCol = 0; iCol < static_cast<HighsInt>(lp.integrality_.size());
       iCol++) {
    switch (lp.integrality_[iCol]) {
      case HighsVarType::kInteger:
        num_integer++;
        if (lp.col_lower_[iCol] == 0 && lp.col_upper_[iCol] == 1) num_binary++;
        break;
      case HighsVarType::kSemiContinuous:
        num_semi_continuous++;
        break;
      case HighsVarType::kSemiInteger:
        num_semi_integer++;
        break;
      default:
        break;
    }
  }
  std::string problem_type;
  const bool non_continuous =
      num_integer + num_semi_continuous + num_semi_integer;
  if (hessian.dim_) {
    if (non_continuous) {
      problem_type = "MIQP";
    } else {
      problem_type = "QP  ";
    }
  } else {
    if (non_continuous) {
      problem_type = "MIP ";
    } else {
      problem_type = "LP  ";
    }
  }
  const HighsInt a_num_nz = lp.a_matrix_.numNz();
  const HighsInt q_num_nz = hessian.dim_ > 0 ? hessian.numNz() : 0;
  if (*log_options.log_dev_level) {
    highsLogDev(log_options, HighsLogType::kInfo, "%4s      : %s\n",
                problem_type.c_str(), lp.model_name_.c_str());
    highsLogDev(log_options, HighsLogType::kInfo,
                "Rows      : %" HIGHSINT_FORMAT "\n", lp.num_row_);
    highsLogDev(log_options, HighsLogType::kInfo,
                "Cols      : %" HIGHSINT_FORMAT "\n", lp.num_col_);
    if (q_num_nz) {
      highsLogDev(log_options, HighsLogType::kInfo,
                  "Matrix Nz : %" HIGHSINT_FORMAT "\n", a_num_nz);
      highsLogDev(log_options, HighsLogType::kInfo,
                  "Hessian Nz: %" HIGHSINT_FORMAT "\n", q_num_nz);
    } else {
      highsLogDev(log_options, HighsLogType::kInfo,
                  "Nonzeros  : %" HIGHSINT_FORMAT "\n", a_num_nz);
    }
    if (num_integer)
      highsLogDev(log_options, HighsLogType::kInfo,
                  "Integer   : %" HIGHSINT_FORMAT " (%" HIGHSINT_FORMAT
                  " binary)\n",
                  num_integer, num_binary);
    if (num_semi_continuous)
      highsLogDev(log_options, HighsLogType::kInfo,
                  "SemiConts : %" HIGHSINT_FORMAT "\n", num_semi_continuous);
    if (num_semi_integer)
      highsLogDev(log_options, HighsLogType::kInfo,
                  "SemiInt   : %" HIGHSINT_FORMAT "\n", num_semi_integer);
  } else {
    std::stringstream stats_line;
    stats_line << problem_type;
    if (lp.model_name_.length()) stats_line << " " << lp.model_name_;
    stats_line << " has " << lp.num_row_ << " rows; " << lp.num_col_ << " cols";
    if (q_num_nz) {
      stats_line << "; " << a_num_nz << " matrix nonzeros";
      stats_line << "; " << q_num_nz << " Hessian nonzeros";
    } else {
      stats_line << "; " << a_num_nz << " nonzeros";
    }
    if (num_integer)
      stats_line << "; " << num_integer << " integer variables (" << num_binary
                 << " binary)";
    if (num_semi_continuous)
      stats_line << "; " << num_semi_continuous << " semi-continuous variables";
    if (num_semi_integer)
      stats_line << "; " << num_semi_integer << " semi-integer variables";
    highsLogUser(log_options, HighsLogType::kInfo, "%s\n",
                 stats_line.str().c_str());
  }
}